

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O2

difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
* __thiscall
burst::
make_difference_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,boost::iterator_range<std::_Fwd_list_const_iterator<int>>,void>
          (difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          iterator_range<std::_Fwd_list_const_iterator<int>_> *minuend,
          iterator_range<std::_Fwd_list_const_iterator<int>_> *subtrahend)

{
  difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
  ::difference_iterator
            (__return_storage_ptr__,*(undefined8 *)this,*(undefined8 *)(this + 8),
             (minuend->
             super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_node,
             (minuend->
             super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             ).m_End._M_node);
  return __return_storage_ptr__;
}

Assistant:

auto make_difference_iterator (ForwardRange1 && minuend, ForwardRange2 && subtrahend)
    {
        using std::begin;
        using std::end;
        return
            make_difference_iterator
            (
                begin(std::forward<ForwardRange1>(minuend)),
                end(std::forward<ForwardRange1>(minuend)),
                begin(std::forward<ForwardRange2>(subtrahend)),
                end(std::forward<ForwardRange2>(subtrahend))
            );
    }